

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_class_name(parser *p)

{
  void *pvVar1;
  undefined8 *v;
  char *pcVar2;
  
  pvVar1 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x110);
  pcVar2 = parser_getstr(p,"name");
  pcVar2 = string_make(pcVar2);
  v[1] = pcVar2;
  *v = pvVar1;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_class_name(struct parser *p) {
	struct player_class *h = parser_priv(p);
	struct player_class *c = mem_zalloc(sizeof *c);
	c->name = string_make(parser_getstr(p, "name"));
	c->next = h;
	parser_setpriv(p, c);
	return PARSE_ERROR_NONE;
}